

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_crt_check_parent(mbedtls_x509_crt *child,mbedtls_x509_crt *parent,int top,int bottom)

{
  size_t sVar1;
  size_t len;
  int iVar2;
  int iVar3;
  int iVar4;
  mbedtls_asn1_named_data *pmVar5;
  mbedtls_asn1_named_data *pmVar6;
  
  pmVar6 = &child->issuer;
  pmVar5 = &parent->subject;
  do {
    if (pmVar6 == (mbedtls_asn1_named_data *)0x0 && pmVar5 == (mbedtls_x509_name *)0x0) {
      if (top != 0) {
        iVar2 = parent->version;
        if ((bottom == 0) || (sVar1 = (child->raw).len, sVar1 != (parent->raw).len)) {
          if (iVar2 < 3) {
            return 0;
          }
        }
        else {
          iVar4 = bcmp((child->raw).p,(parent->raw).p,sVar1);
          if (iVar4 == 0 || iVar2 < 3) {
            return 0;
          }
        }
      }
      if (parent->ca_istrue != 0) {
        iVar2 = mbedtls_x509_crt_check_key_usage(parent,4);
        if (iVar2 == 0) {
          return 0;
        }
        return -1;
      }
      return -1;
    }
    if ((((pmVar6 == (mbedtls_asn1_named_data *)0x0) || (pmVar5 == (mbedtls_x509_name *)0x0)) ||
        ((pmVar6->oid).tag != (pmVar5->oid).tag)) ||
       ((sVar1 = (pmVar6->oid).len, sVar1 != (pmVar5->oid).len ||
        (iVar2 = bcmp((pmVar6->oid).p,(pmVar5->oid).p,sVar1), iVar2 != 0)))) {
      return -1;
    }
    iVar2 = (pmVar6->val).tag;
    iVar4 = (pmVar5->val).tag;
    if (((iVar2 != iVar4) || (sVar1 = (pmVar6->val).len, sVar1 != (pmVar5->val).len)) ||
       (iVar3 = bcmp((pmVar6->val).p,(pmVar5->val).p,sVar1), iVar3 != 0)) {
      if ((iVar2 != 0x13) && (iVar2 != 0xc)) {
        return -1;
      }
      if ((iVar4 != 0x13) && (iVar4 != 0xc)) {
        return -1;
      }
      len = (pmVar6->val).len;
      if (len != (pmVar5->val).len) {
        return -1;
      }
      iVar2 = x509_memcasecmp((pmVar6->val).p,(pmVar5->val).p,len);
      if (iVar2 != 0) {
        return -1;
      }
    }
    if (pmVar6->next_merged != pmVar5->next_merged) {
      return -1;
    }
    pmVar6 = pmVar6->next;
    pmVar5 = pmVar5->next;
  } while( true );
}

Assistant:

static int x509_crt_check_parent( const mbedtls_x509_crt *child,
                                  const mbedtls_x509_crt *parent,
                                  int top, int bottom )
{
    int need_ca_bit;

    /* Parent must be the issuer */
    if( x509_name_cmp( &child->issuer, &parent->subject ) != 0 )
        return( -1 );

    /* Parent must have the basicConstraints CA bit set as a general rule */
    need_ca_bit = 1;

    /* Exception: v1/v2 certificates that are locally trusted. */
    if( top && parent->version < 3 )
        need_ca_bit = 0;

    /* Exception: self-signed end-entity certs that are locally trusted. */
    if( top && bottom &&
        child->raw.len == parent->raw.len &&
        memcmp( child->raw.p, parent->raw.p, child->raw.len ) == 0 )
    {
        need_ca_bit = 0;
    }

    if( need_ca_bit && ! parent->ca_istrue )
        return( -1 );

#if defined(MBEDTLS_X509_CHECK_KEY_USAGE)
    if( need_ca_bit &&
        mbedtls_x509_crt_check_key_usage( parent, MBEDTLS_X509_KU_KEY_CERT_SIGN ) != 0 )
    {
        return( -1 );
    }
#endif

    return( 0 );
}